

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryToLocaleString(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_24_3_24541790 implicitCall;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  JavascriptFunction *function_00;
  JavascriptLibrary *this;
  JavascriptFunction *pJVar7;
  RecyclableObject *toStringFunc;
  Var toStringVar;
  RecyclableObject *dynamicObject;
  Var thisValue;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x175,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  thisValue = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x177,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x178,"(args.Info.Count)","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  dynamicObject = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,0);
  toStringVar = (Var)0x0;
  BVar3 = JavascriptConversion::ToObject
                    (dynamicObject,(ScriptContext *)thisValue,(RecyclableObject **)&toStringVar);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)thisValue,-0x7ff5ec42,L"Object.prototype.toLocaleString");
  }
  toStringFunc = (RecyclableObject *)0x0;
  BVar3 = Js::JavascriptOperators::GetProperty
                    (dynamicObject,(RecyclableObject *)toStringVar,0x178,&toStringFunc,
                     (ScriptContext *)thisValue,(PropertyValueInfo *)0x0);
  if (BVar3 != 0) {
    bVar2 = JavascriptConversion::IsCallable(toStringFunc);
    if (bVar2) {
      function_00 = (JavascriptFunction *)VarTo<Js::RecyclableObject>(toStringFunc);
      this = ScriptContext::GetLibrary((ScriptContext *)thisValue);
      pJVar7 = JavascriptLibrary::GetObjectToStringFunction(this);
      if (function_00 == pJVar7) {
        callInfo_local = (CallInfo)ToStringHelper(dynamicObject,(ScriptContext *)thisValue);
      }
      else {
        pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)thisValue);
        implicitCall.toStringFunc = (RecyclableObject *)function_00;
        implicitCall.scriptContext = (ScriptContext *)thisValue;
        implicitCall.thisValue = dynamicObject;
        callInfo_local =
             (CallInfo)
             ThreadContext::
             ExecuteImplicitCall<Js::JavascriptObject::EntryToLocaleString(Js::RecyclableObject*,Js::CallInfo,___)::__0>
                       (pTVar5,(RecyclableObject *)function_00,ImplicitCall_ToPrimitive,implicitCall
                       );
      }
      return (Var)callInfo_local;
    }
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)thisValue,-0x7ff5ec34,L"Object.prototype.toLocaleString");
}

Assistant:

Var JavascriptObject::EntryToLocaleString(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    Assert(!(callInfo.Flags & CallFlags_New));
    AssertMsg(args.Info.Count, "Should always have implicit 'this'");

    Var thisValue = args[0];
    RecyclableObject* dynamicObject = nullptr;

    if (FALSE == JavascriptConversion::ToObject(thisValue, scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.toLocaleString"));
    }

    Var toStringVar = nullptr;
    if (!JavascriptOperators::GetProperty(thisValue, dynamicObject, Js::PropertyIds::toString, &toStringVar, scriptContext) || !JavascriptConversion::IsCallable(toStringVar))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Object.prototype.toLocaleString"));
    }

    RecyclableObject* toStringFunc = VarTo<RecyclableObject>(toStringVar);
    if (toStringFunc == scriptContext->GetLibrary()->GetObjectToStringFunction())
    {
        return ToStringHelper(thisValue, scriptContext);
    }
    else
    {
        return scriptContext->GetThreadContext()->ExecuteImplicitCall(toStringFunc, Js::ImplicitCall_ToPrimitive, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), toStringFunc, CallInfo(CallFlags_Value, 1), thisValue);
        });
    }
}